

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitterBeam.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::EmitterBeam::Encode(EmitterBeam *this,KDataStream *stream)

{
  pointer pTVar1;
  pointer pTVar2;
  
  KDataStream::Write(stream,this->m_ui8BeamDataLength);
  KDataStream::Write(stream,this->m_ui8EmitterBeamIDNumber);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16BeamParamIndex);
  (*(this->m_FundamentalParameterData).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_FundamentalParameterData,stream);
  KDataStream::Write(stream,this->m_ui8BeamFunction);
  KDataStream::Write(stream,this->m_ui8NumTargetInTrackJamField);
  KDataStream::Write(stream,this->m_ui8HighDensityTrackJam);
  (*(this->m_BeamStatus).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_BeamStatus,stream);
  (*(this->m_JammingTechnique).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_JammingTechnique,stream);
  pTVar1 = (this->m_vTrackJamTargets).
           super__Vector_base<KDIS::DATA_TYPE::TrackJamTargetIdentifier,_std::allocator<KDIS::DATA_TYPE::TrackJamTargetIdentifier>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pTVar2 = (this->m_vTrackJamTargets).
                super__Vector_base<KDIS::DATA_TYPE::TrackJamTargetIdentifier,_std::allocator<KDIS::DATA_TYPE::TrackJamTargetIdentifier>_>
                ._M_impl.super__Vector_impl_data._M_start; pTVar2 != pTVar1; pTVar2 = pTVar2 + 1) {
    (*(pTVar2->super_EntityIdentifier).super_SimulationIdentifier.super_DataTypeBase.
      _vptr_DataTypeBase[5])(pTVar2,stream);
  }
  return;
}

Assistant:

void EmitterBeam::Encode( KDataStream & stream ) const
{
    stream << m_ui8BeamDataLength
           << m_ui8EmitterBeamIDNumber
           << m_ui16BeamParamIndex
           << KDIS_STREAM m_FundamentalParameterData
           << m_ui8BeamFunction
           << m_ui8NumTargetInTrackJamField
           << m_ui8HighDensityTrackJam
#if DIS_VERSION < 7
           << m_ui8Padding
           << m_ui32JammingModeSequence;
#elif DIS_VERSION > 6
           << KDIS_STREAM m_BeamStatus
           << KDIS_STREAM m_JammingTechnique;
#endif

    vector<TrackJamTargetIdentifier>::const_iterator citr = m_vTrackJamTargets.begin();
    vector<TrackJamTargetIdentifier>::const_iterator citrEnd = m_vTrackJamTargets.end();

    for( ; citr != citrEnd; ++citr )
    {
        citr->Encode( stream );
    }
}